

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O2

object * do_Integer(int op,object *low,object *high)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  long val;
  object *poVar3;
  object **ppoVar4;
  
  if (6 < op - 0x19U) {
    error_impl("do_Integer",0x2a0,"do_Integer(): Invalid primitive integer operation %d!");
    return (object *)0x0;
  }
  uVar1 = low[1].header;
  uVar2 = high[1].header;
  switch(op) {
  case 0x19:
    if (uVar2 == 0) {
      return (object *)0x0;
    }
    val = (long)uVar1 / (long)uVar2;
    break;
  case 0x1a:
    if (uVar2 == 0) {
      return (object *)0x0;
    }
    val = (long)uVar1 % (long)uVar2;
    break;
  case 0x1b:
    val = uVar2 + uVar1;
    break;
  case 0x1c:
    val = uVar2 * uVar1;
    break;
  case 0x1d:
    val = uVar1 - uVar2;
    break;
  case 0x1e:
    if ((long)uVar2 <= (long)uVar1) {
LAB_0010a635:
      ppoVar4 = &falseObject;
      goto LAB_0010a63c;
    }
    goto LAB_0010a627;
  case 0x1f:
    if (uVar1 != uVar2) goto LAB_0010a635;
LAB_0010a627:
    ppoVar4 = &trueObject;
LAB_0010a63c:
    return *ppoVar4;
  }
  poVar3 = newLInteger(val);
  return poVar3;
}

Assistant:

struct object *do_Integer(int op, struct object *low, struct object *high)
{
    int64_t l, h;
    int64_t *tmp;

    tmp = (int64_t *)bytePtr(low);
    l = *tmp;
    tmp = (int64_t *)bytePtr(high);
    h = *tmp;
    switch (op) {
    case 25:    /* Integer division */
        if (h == 0LL) {
            return(NULL);
        }
        return(newLInteger(l/h));

    case 26:    /* Integer remainder */
        if (h == 0LL) {
            return(NULL);
        }
        return(newLInteger(l%h));

    case 27:    /* Integer addition */
        return(newLInteger(l+h));

    case 28:    /* Integer multiplication */
        return(newLInteger(l*h));

    case 29:    /* Integer subtraction */
        return(newLInteger(l-h));

    case 30:    /* Integer less than */
        return((l < h) ? trueObject : falseObject);

    case 31:    /* Integer equality */
        return((l == h) ? trueObject : falseObject);

    default:
        error("do_Integer(): Invalid primitive integer operation %d!", op);
    }
    return(NULL);
}